

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

vector<lest::test,_std::allocator<lest::test>_> * __thiscall
lest::make<std::vector<lest::test,std::allocator<lest::test>>,lest::test>
          (vector<lest::test,_std::allocator<lest::test>_> *__return_storage_ptr__,lest *this,
          test *first,test *last)

{
  undefined1 local_38 [8];
  vector<lest::test,_std::allocator<lest::test>_> result;
  test *last_local;
  test *first_local;
  
  result.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = first;
  std::vector<lest::test,_std::allocator<lest::test>_>::vector
            ((vector<lest::test,_std::allocator<lest::test>_> *)local_38);
  for (last_local = (test *)this;
      last_local !=
      result.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage; last_local = last_local + 1) {
    std::vector<lest::test,_std::allocator<lest::test>_>::push_back
              ((vector<lest::test,_std::allocator<lest::test>_> *)local_38,last_local);
  }
  std::vector<lest::test,_std::allocator<lest::test>_>::vector
            (__return_storage_ptr__,(vector<lest::test,_std::allocator<lest::test>_> *)local_38);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector
            ((vector<lest::test,_std::allocator<lest::test>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

C make( T const * first, T const * const last )
{
    C result;
    for ( ; first != last; ++first )
    {
       result.push_back( *first );
    }
    return result;
}